

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib_table.c
# Opt level: O2

int lj_cf_table_foreach(lua_State *L)

{
  int iVar1;
  GCtab *t;
  GCfunc *pGVar2;
  TValue *pTVar3;
  
  t = lj_lib_checktab(L,1);
  pGVar2 = lj_lib_checkfunc(L,2);
  L->top = L->base + 3;
  *(undefined4 *)((long)L->base + 0x14) = 0xffffffff;
  pTVar3 = L->top;
  while( true ) {
    iVar1 = lj_tab_next(L,t,pTVar3 + -1);
    if (iVar1 == 0) {
      return 0;
    }
    L->top[2] = *L->top;
    L->top[1] = L->top[-1];
    pTVar3 = L->top;
    (pTVar3->u32).lo = (uint32_t)pGVar2;
    (pTVar3->field_2).it = 0xfffffff7;
    L->top = L->top + 3;
    lua_call(L,2,1);
    if (*(int *)((long)L->top + -4) != -1) break;
    pTVar3 = L->top + -1;
    L->top = pTVar3;
  }
  return 1;
}

Assistant:

LJLIB_CF(table_foreach)
{
  GCtab *t = lj_lib_checktab(L, 1);
  GCfunc *func = lj_lib_checkfunc(L, 2);
  L->top = L->base+3;
  setnilV(L->top-1);
  while (lj_tab_next(L, t, L->top-1)) {
    copyTV(L, L->top+2, L->top);
    copyTV(L, L->top+1, L->top-1);
    setfuncV(L, L->top, func);
    L->top += 3;
    lua_call(L, 2, 1);
    if (!tvisnil(L->top-1))
      return 1;
    L->top--;
  }
  return 0;
}